

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ConcurrentAssertionStatementSyntax * __thiscall
slang::parsing::Parser::parseConcurrentAssertion
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token propertyOrSequence_00;
  bool bVar1;
  logic_error *this_00;
  ConcurrentAssertionStatementSyntax *pCVar2;
  Token openParen_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_1f8;
  ActionBlockSyntax *local_1c8;
  ActionBlockSyntax *action;
  Token closeParen;
  PropertySpecSyntax *spec;
  Token openParen;
  string local_190;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  undefined1 local_68 [8];
  Token keyword;
  Token propertyOrSequence;
  SyntaxKind kind;
  NamedLabelSyntax *label_local;
  Parser *this_local;
  AttrList attributes_local;
  
  Token::Token((Token *)&keyword.info);
  _local_68 = ParserBase::consume(&this->super_ParserBase);
  if (local_68._0_2_ == AssertKeyword) {
    propertyOrSequence.info._4_4_ = AssertPropertyStatement;
    local_78 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
    keyword.info = (Info *)local_78._0_8_;
    propertyOrSequence._0_8_ = local_78.info;
  }
  else if (local_68._0_2_ == AssumeKeyword) {
    propertyOrSequence.info._4_4_ = AssumePropertyStatement;
    local_88 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
    keyword.info = (Info *)local_88._0_8_;
    propertyOrSequence._0_8_ = local_88.info;
  }
  else if (local_68._0_2_ == CoverKeyword) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,SequenceKeyword);
    if (bVar1) {
      propertyOrSequence.info._4_4_ = CoverSequenceStatement;
      local_98 = ParserBase::consume(&this->super_ParserBase);
      keyword.info = (Info *)local_98._0_8_;
      propertyOrSequence._0_8_ = local_98.info;
    }
    else {
      propertyOrSequence.info._4_4_ = CoverPropertyStatement;
      local_a8 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      keyword.info = (Info *)local_a8._0_8_;
      propertyOrSequence._0_8_ = local_a8.info;
    }
  }
  else if (local_68._0_2_ == ExpectKeyword) {
    propertyOrSequence.info._4_4_ = ExpectPropertyStatement;
  }
  else {
    if (local_68._0_2_ != RestrictKeyword) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Parser_statements.cpp"
                 ,&local_159);
      std::operator+(&local_138,&local_158,":");
      std::__cxx11::to_string(&local_190,0x240);
      std::operator+(&local_118,&local_138,&local_190);
      std::operator+(&local_f8,&local_118,": ");
      std::operator+(&local_d8,&local_f8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_d8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    propertyOrSequence.info._4_4_ = RestrictPropertyStatement;
    local_b8 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
    keyword.info = (Info *)local_b8._0_8_;
    propertyOrSequence._0_8_ = local_b8.info;
  }
  openParen_00 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  closeParen.info = (Info *)parsePropertySpec(this);
  _action = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_1c8 = parseActionBlock(this);
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_1f8,attributes);
  propertyOrSequence_00.info = (Info *)propertyOrSequence._0_8_;
  propertyOrSequence_00._0_8_ = keyword.info;
  pCVar2 = slang::syntax::SyntaxFactory::concurrentAssertionStatement
                     (&this->factory,propertyOrSequence.info._4_4_,label,&local_1f8,_local_68,
                      propertyOrSequence_00,openParen_00,(PropertySpecSyntax *)closeParen.info,
                      _action,local_1c8);
  return pCVar2;
}

Assistant:

ConcurrentAssertionStatementSyntax& Parser::parseConcurrentAssertion(NamedLabelSyntax* label,
                                                                     AttrList attributes) {

    SyntaxKind kind = SyntaxKind::Unknown;
    Token propertyOrSequence;
    auto keyword = consume();

    switch (keyword.kind) {
        case TokenKind::AssertKeyword:
            kind = SyntaxKind::AssertPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::AssumeKeyword:
            kind = SyntaxKind::AssumePropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::CoverKeyword:
            if (peek(TokenKind::SequenceKeyword)) {
                kind = SyntaxKind::CoverSequenceStatement;
                propertyOrSequence = consume();
            }
            else {
                kind = SyntaxKind::CoverPropertyStatement;
                propertyOrSequence = expect(TokenKind::PropertyKeyword);
            }
            break;
        case TokenKind::RestrictKeyword:
            kind = SyntaxKind::RestrictPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::ExpectKeyword:
            kind = SyntaxKind::ExpectPropertyStatement;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& spec = parsePropertySpec();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& action = parseActionBlock();

    return factory.concurrentAssertionStatement(kind, label, attributes, keyword,
                                                propertyOrSequence, openParen, spec, closeParen,
                                                action);
}